

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_function_decl(gvisitor_t *self,gnode_function_decl_t *node)

{
  uint16_t nlocals;
  char *identifier;
  size_t sVar1;
  gnode_literal_expr_t *node_00;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  ircode_t *piVar6;
  gravity_function_t *f_00;
  gravity_value_t *pgVar7;
  void *pvVar8;
  bool bVar9;
  gravity_value_t gVar10;
  uint16_t local_148;
  gnode_t *local_140;
  gnode_t *local_138;
  uint32_t local_12c;
  uint32_t local_11c;
  uint32_t local_10c;
  uint32_t local_fc;
  long local_f0;
  size_t local_e8;
  size_t local_e0;
  gnode_t *local_d8;
  gnode_var_t *local_d0;
  bool local_b1;
  gravity_vm *local_b0;
  uint16_t local_a4;
  gnode_t *val;
  size_t _i;
  size_t _len;
  ircode_t *code;
  ircode_t *code_1;
  gravity_value_t value;
  gnode_literal_expr_t *literal;
  gravity_value_t name;
  gnode_var_t *param;
  size_t i;
  size_t len;
  _Bool is_constructor;
  gravity_function_t *f;
  uint16_t nparams;
  _Bool is_class_ctx;
  gravity_object_t *context_object;
  gnode_function_decl_t *node_local;
  gvisitor_t *self_local;
  
  if (node->storage != TOK_KEY_EXTERN) {
    bVar9 = (gravity_class_t *)
            **(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8) ==
            gravity_class_class;
    if (node->params == (gnode_r *)0x0) {
      local_a4 = 0;
    }
    else {
      local_a4 = (uint16_t)node->params->n;
    }
    if (bVar9) {
      local_b0 = (gravity_vm *)0x0;
    }
    else {
      local_b0 = *(gravity_vm **)((long)self->data + 0x38);
    }
    identifier = node->identifier;
    nlocals = node->nlocals;
    piVar6 = ircode_create(node->nlocals + local_a4);
    f_00 = gravity_function_new(local_b0,identifier,local_a4,nlocals,0,piVar6);
    iVar5 = string_cmp(node->identifier,"init");
    local_b1 = iVar5 == 0 && bVar9;
    if (node->params == (gnode_r *)0x0) {
      local_d0 = (gnode_var_t *)0x0;
    }
    else {
      local_d0 = (gnode_var_t *)node->params->n;
    }
    for (param = (gnode_var_t *)0x1; param < local_d0;
        param = (gnode_var_t *)((long)&(param->base).tag + 1)) {
      if (param < (gnode_var_t *)node->params->n) {
        local_d8 = node->params->p[(long)param];
      }
      else {
        local_d8 = (gnode_t *)0x0;
      }
      gVar10 = gravity_string_to_value
                         ((gravity_vm *)0x0,*(char **)&local_d8[1].block_length,0xffffffff);
      if ((f_00->field_9).field_0.pname.n == (f_00->field_9).field_0.pname.m) {
        if ((f_00->field_9).field_0.pname.m == 0) {
          local_e0 = 8;
        }
        else {
          local_e0 = (f_00->field_9).field_0.pname.m << 1;
        }
        (f_00->field_9).field_0.pname.m = local_e0;
        pgVar7 = (gravity_value_t *)
                 realloc((f_00->field_9).field_0.pname.p,(f_00->field_9).field_0.pname.m << 4);
        (f_00->field_9).field_0.pname.p = pgVar7;
      }
      pgVar7 = (f_00->field_9).field_0.pname.p;
      sVar1 = (f_00->field_9).field_0.pname.n;
      (f_00->field_9).field_0.pname.n = sVar1 + 1;
      pgVar7 = pgVar7 + sVar1;
      literal = (gnode_literal_expr_t *)gVar10.isa;
      pgVar7->isa = (gravity_class_t *)literal;
      name.isa = (gravity_class_t *)gVar10.field_1;
      (pgVar7->field_1).p = name.isa;
      if ((node->has_defaults & 1U) != 0) {
        node_00 = *(gnode_literal_expr_t **)&local_d8[1].token.colno;
        if (node_00 == (gnode_literal_expr_t *)0x0) {
          value.isa = (gravity_class_t *)0x1;
          code_1 = (ircode_t *)gravity_class_null;
        }
        else {
          _code_1 = literal2value(node_00);
        }
        if ((f_00->field_9).field_0.pvalue.n == (f_00->field_9).field_0.pvalue.m) {
          if ((f_00->field_9).field_0.pvalue.m == 0) {
            local_e8 = 8;
          }
          else {
            local_e8 = (f_00->field_9).field_0.pvalue.m << 1;
          }
          (f_00->field_9).field_0.pvalue.m = local_e8;
          pgVar7 = (gravity_value_t *)
                   realloc((f_00->field_9).field_0.pvalue.p,(f_00->field_9).field_0.pvalue.m << 4);
          (f_00->field_9).field_0.pvalue.p = pgVar7;
        }
        pgVar7 = (f_00->field_9).field_0.pvalue.p;
        sVar1 = (f_00->field_9).field_0.pvalue.n;
        (f_00->field_9).field_0.pvalue.n = sVar1 + 1;
        pgVar7 = pgVar7 + sVar1;
        pgVar7->isa = (gravity_class_t *)code_1;
        (pgVar7->field_1).p = value.isa;
      }
    }
    if (*self->data == *(long *)((long)self->data + 8)) {
      if (*(long *)((long)self->data + 8) == 0) {
        local_f0 = 8;
      }
      else {
        local_f0 = *(long *)((long)self->data + 8) << 1;
      }
      *(long *)((long)self->data + 8) = local_f0;
      pvVar8 = realloc(*(void **)((long)self->data + 0x10),*(long *)((long)self->data + 8) << 3);
      *(void **)((long)self->data + 0x10) = pvVar8;
    }
    lVar2 = *(long *)((long)self->data + 0x10);
    lVar3 = *self->data;
    *(long *)self->data = lVar3 + 1;
    *(gravity_function_t **)(lVar2 + lVar3 * 8) = f_00;
    if (local_b1) {
      piVar6 = (ircode_t *)(f_00->field_9).field_0.bytecode;
      if (piVar6 == (ircode_t *)0x0) {
        report_error(self,&node->base,"Invalid code context.");
        return;
      }
      if (node == (gnode_function_decl_t *)0x0) {
        local_fc = 0;
      }
      else {
        local_fc = (node->base).token.lineno;
      }
      ircode_add_skip(piVar6,local_fc);
      if (node == (gnode_function_decl_t *)0x0) {
        local_10c = 0;
      }
      else {
        local_10c = (node->base).token.lineno;
      }
      ircode_add_skip(piVar6,local_10c);
      if (node == (gnode_function_decl_t *)0x0) {
        local_11c = 0;
      }
      else {
        local_11c = (node->base).token.lineno;
      }
      ircode_add_skip(piVar6,local_11c);
      if (node == (gnode_function_decl_t *)0x0) {
        local_12c = 0;
      }
      else {
        local_12c = (node->base).token.lineno;
      }
      ircode_add_skip(piVar6,local_12c);
    }
    piVar6 = (ircode_t *)(f_00->field_9).field_0.bytecode;
    if (node->block != (gnode_compound_stmt_t *)0x0) {
      if (node->block->stmts == (gnode_r *)0x0) {
        local_138 = (gnode_t *)0x0;
      }
      else {
        local_138 = (gnode_t *)node->block->stmts->n;
      }
      for (val = (gnode_t *)0x0; val < local_138; val = (gnode_t *)((long)&val->tag + 1)) {
        if (val < (gnode_t *)node->block->stmts->n) {
          local_140 = node->block->stmts->p[(long)val];
        }
        else {
          local_140 = (gnode_t *)0x0;
        }
        gvisit(self,local_140);
        ircode_register_temps_clear(piVar6);
      }
    }
    if (node->uplist != (gupvalue_r *)0x0) {
      if (node->uplist == (gupvalue_r *)0x0) {
        local_148 = 0;
      }
      else {
        local_148 = (uint16_t)node->uplist->n;
      }
      f_00->nupvalues = local_148;
    }
    *(long *)self->data = *self->data + -1;
    _Var4 = ircode_iserror((ircode_t *)(f_00->field_9).field_0.bytecode);
    if (_Var4) {
      report_error(self,&node->base,"Maximum number of available registers used in function %s.",
                   f_00->identifier);
    }
    store_declaration(self,(gravity_object_t *)f_00,node->storage == TOK_KEY_STATIC,node);
    if (iVar5 != 0 || !bVar9) {
      gravity_optimizer(f_00,(_Bool)(self->bflag & 1));
    }
  }
  return;
}

Assistant:

static void visit_function_decl (gvisitor_t *self, gnode_function_decl_t *node) {
    DEBUG_CODEGEN("visit_function_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    DECLARE_CONTEXT();
    bool is_class_ctx = OBJECT_ISA_CLASS(context_object);

    // create new function object
    uint16_t nparams = (node->params) ? (uint16_t)marray_size(*node->params) : 0;
    gravity_function_t *f = gravity_function_new((is_class_ctx) ? NULL : GET_VM(), node->identifier,
                                                 nparams, node->nlocals, 0, (void *)ircode_create(node->nlocals+nparams));

    // check if f is a special constructor function (init)
    // name must be CLASS_CONSTRUCTOR_NAME and context_object must be a class
    bool is_constructor = (string_cmp(node->identifier, CLASS_CONSTRUCTOR_NAME) == 0) && (is_class_ctx);

    // loop at each param to save name and check for default values
    // loop from 1 in order to skip implicit self argument
    size_t len = gnode_array_size(node->params);
    for (size_t i=1; i<len; ++i) {
        gnode_var_t *param = (gnode_var_t *)gnode_array_get(node->params, i);
        gravity_value_t name = VALUE_FROM_CSTRING(NULL, param->identifier);
        marray_push(gravity_value_t, f->pname, name);
        
        if (node->has_defaults) {
            // LOOP for each node->params[i]->expr and convert literal to gravity_value_t
            // if expr is NULL then compute value as UNDEFINED (and add each one to f->defaults preserving the index)
            gnode_literal_expr_t *literal = (gnode_literal_expr_t *)param->expr;
            gravity_value_t value = (literal) ? literal2value(literal) : VALUE_FROM_UNDEFINED;
            marray_push(gravity_value_t, f->pvalue, value);
        }
    }
    
    CONTEXT_PUSH(f);

    if (is_constructor) {
        // reserve first four instructions that could be later filled with a CALL to $init
        // see process_constructor for more information
        ircode_t *code = (ircode_t *)f->bytecode;
        if (!code) {report_error(self, (gnode_t *)node, "Invalid code context."); return;}
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
    }

    // process inner block
    ircode_t *code = (ircode_t *)f->bytecode;
    if (node->block) {
        gnode_array_each(node->block->stmts, {
            // process node
            visit(val);
            // reset temp registers after each node
            ircode_register_temps_clear(code);
        });
    }

    // check for upvalues
    if (node->uplist) f->nupvalues = (uint16_t)gnode_array_size(node->uplist);

    // remove current function
    CONTEXT_POP();

    // check for ircode errors
    if (ircode_iserror((ircode_t *)f->bytecode))
        report_error(self, (gnode_t *)node, "Maximum number of available registers used in function %s.", f->identifier);

    // store function in current context
    store_declaration(self, (gravity_object_t *)f, (node->storage == TOK_KEY_STATIC), node);

    // convert ircode to bytecode (postpone optimization of the constructor)
	if (!is_constructor) gravity_optimizer(f, self->bflag);
}